

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttrack.h
# Opt level: O1

void __thiscall
drace::detector::Fasttrack<std::shared_mutex>::allocate
          (Fasttrack<std::shared_mutex> *this,tls_t tls,void *pc,void *addr,size_t size)

{
  shared_mutex *__rwlock;
  undefined1 auVar1 [16];
  int iVar2;
  uint uVar3;
  undefined8 uVar4;
  size_t hash;
  raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_long,_unsigned_long>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  *this_00;
  iterator iVar5;
  size_t address;
  void *local_80;
  size_t local_78;
  void *local_70;
  _Head_base<0UL,_unsigned_long_&,_false> local_68;
  _Head_base<0UL,_unsigned_long_&,_false> local_60;
  pair<phmap::container_internal::parallel_hash_set<4UL,_phmap::container_internal::raw_hash_set,_phmap::NullMutex,_phmap::container_internal::FlatHashMapPolicy<unsigned_long,_unsigned_long>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>::iterator,_bool>
  local_58;
  
  __rwlock = &this->g_lock;
  local_80 = addr;
  iVar2 = pthread_rwlock_wrlock((pthread_rwlock_t *)__rwlock);
  if (iVar2 != 0x23) {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = local_80;
    hash = SUB168(ZEXT816(0xde5fb9d2630458e9) * auVar1,8) +
           SUB168(ZEXT816(0xde5fb9d2630458e9) * auVar1,0);
    uVar3 = (((uint)(hash >> 4) & 0xfffffff ^ (uint)hash) & 0xf) << 6;
    this_00 = (raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_long,_unsigned_long>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
               *)((long)&(this->allocs).
                         super_parallel_hash_map<4UL,_phmap::container_internal::raw_hash_set,_phmap::NullMutex,_phmap::container_internal::FlatHashMapPolicy<unsigned_long,_unsigned_long>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                         .
                         super_parallel_hash_set<4UL,_phmap::container_internal::raw_hash_set,_phmap::NullMutex,_phmap::container_internal::FlatHashMapPolicy<unsigned_long,_unsigned_long>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                         .sets_._M_elems[0].set_.ctrl_ + (ulong)uVar3);
    iVar5 = phmap::container_internal::
            raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_long,_unsigned_long>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
            ::find<unsigned_long>(this_00,(key_arg<unsigned_long> *)&local_80,hash);
    if (this_00->ctrl_ +
        *(long *)((long)&(this->allocs).
                         super_parallel_hash_map<4UL,_phmap::container_internal::raw_hash_set,_phmap::NullMutex,_phmap::container_internal::FlatHashMapPolicy<unsigned_long,_unsigned_long>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                         .
                         super_parallel_hash_set<4UL,_phmap::container_internal::raw_hash_set,_phmap::NullMutex,_phmap::container_internal::FlatHashMapPolicy<unsigned_long,_unsigned_long>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                         .sets_._M_elems[0].set_.capacity_ + (ulong)uVar3) == iVar5.ctrl_) {
      local_68._M_head_impl = (unsigned_long *)&local_70;
      local_70 = local_80;
      local_60._M_head_impl = &local_78;
      local_78 = size;
      phmap::container_internal::
      parallel_hash_set<4ul,phmap::container_internal::raw_hash_set,phmap::NullMutex,phmap::container_internal::FlatHashMapPolicy<unsigned_long,unsigned_long>,phmap::Hash<unsigned_long>,phmap::EqualTo<unsigned_long>,std::allocator<std::pair<unsigned_long_const,unsigned_long>>>
      ::
      emplace_decomposable<unsigned_long,std::piecewise_construct_t_const&,std::tuple<unsigned_long&>,std::tuple<unsigned_long&>>
                (&local_58,&this->allocs,local_68._M_head_impl,
                 (piecewise_construct_t *)&std::piecewise_construct,
                 (tuple<unsigned_long_&> *)&local_68,(tuple<unsigned_long_&> *)&local_60);
    }
    pthread_rwlock_unlock((pthread_rwlock_t *)__rwlock);
    return;
  }
  uVar4 = std::__throw_system_error(0x23);
  pthread_rwlock_unlock((pthread_rwlock_t *)__rwlock);
  _Unwind_Resume(uVar4);
}

Assistant:

void allocate(tls_t tls, void* pc, void* addr, size_t size) final {
#if REGARD_ALLOCS
    size_t address = reinterpret_cast<size_t>(addr);
    std::lock_guard<LockT> exLockT(g_lock);
    if (allocs.find(address) == allocs.end()) {
      create_alloc(address, size);
    }
#endif
  }